

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O2

void __thiscall wasm::GenerateDynCalls::doWalkModule(GenerateDynCalls *this,Module *wasm)

{
  list<wasm::HeapType,_std::allocator<wasm::HeapType>_> *plVar1;
  _List_node_base *p_Var2;
  
  Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
              ).
              super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
              .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>,
             wasm);
  plVar1 = &(this->invokeTypes).List;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((_List_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&p_Var2->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)plVar1) {
    generateDynCallThunk(this,(HeapType)p_Var2[1]._M_next);
  }
  return;
}

Assistant:

void doWalkModule(Module* wasm) {
    PostWalker<GenerateDynCalls>::doWalkModule(wasm);
    for (auto& type : invokeTypes) {
      generateDynCallThunk(type);
    }
  }